

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

int Abc_SclReadLibrary(Vec_Str_t *vOut,int *pPos,SC_Lib *p)

{
  int iVar1;
  int iVar2;
  SC_TSense SVar3;
  char *pcVar4;
  SC_WireLoad *Entry;
  SC_WireLoadSel *Entry_00;
  SC_Cell *Entry_01;
  SC_Pin *pSVar5;
  word wVar6;
  Vec_Ptr_t *p_00;
  undefined8 *puVar7;
  char **ppVarNames;
  Vec_Wrd_t *__ptr;
  word wVar8;
  SC_Timings *Entry_02;
  SC_Timing *Entry_03;
  float fVar9;
  SC_Timing *pTime;
  SC_Timings *pRTime;
  word Value;
  Vec_Wrd_t *vFunc;
  Vec_Ptr_t *vNames;
  SC_Pin *pPin2;
  SC_Pin *pPin_1;
  SC_Pin *pPin;
  SC_Cell *pCell;
  SC_WireLoadSel *pWLS;
  SC_WireLoad *pWL;
  int local_38;
  int version;
  int n;
  int k;
  int j;
  int i;
  SC_Lib *p_local;
  int *pPos_local;
  Vec_Str_t *vOut_local;
  
  iVar1 = Vec_StrGetI(vOut,pPos);
  if (iVar1 == 8) {
    pcVar4 = Vec_StrGetS(vOut,pPos);
    p->pName = pcVar4;
    pcVar4 = Vec_StrGetS(vOut,pPos);
    p->default_wire_load = pcVar4;
    pcVar4 = Vec_StrGetS(vOut,pPos);
    p->default_wire_load_sel = pcVar4;
    fVar9 = Vec_StrGetF(vOut,pPos);
    p->default_max_out_slew = fVar9;
    iVar1 = Vec_StrGetI(vOut,pPos);
    p->unit_time = iVar1;
    fVar9 = Vec_StrGetF(vOut,pPos);
    p->unit_cap_fst = fVar9;
    iVar1 = Vec_StrGetI(vOut,pPos);
    p->unit_cap_snd = iVar1;
    for (k = Vec_StrGetI(vOut,pPos); k != 0; k = k + -1) {
      Entry = Abc_SclWireLoadAlloc();
      Vec_PtrPush(&p->vWireLoads,Entry);
      pcVar4 = Vec_StrGetS(vOut,pPos);
      Entry->pName = pcVar4;
      fVar9 = Vec_StrGetF(vOut,pPos);
      Entry->cap = fVar9;
      fVar9 = Vec_StrGetF(vOut,pPos);
      Entry->slope = fVar9;
      for (n = Vec_StrGetI(vOut,pPos); n != 0; n = n + -1) {
        iVar1 = Vec_StrGetI(vOut,pPos);
        Vec_IntPush(&Entry->vFanout,iVar1);
        fVar9 = Vec_StrGetF(vOut,pPos);
        Vec_FltPush(&Entry->vLen,fVar9);
      }
    }
    for (k = Vec_StrGetI(vOut,pPos); k != 0; k = k + -1) {
      Entry_00 = Abc_SclWireLoadSelAlloc();
      Vec_PtrPush(&p->vWireLoadSels,Entry_00);
      pcVar4 = Vec_StrGetS(vOut,pPos);
      Entry_00->pName = pcVar4;
      for (n = Vec_StrGetI(vOut,pPos); n != 0; n = n + -1) {
        fVar9 = Vec_StrGetF(vOut,pPos);
        Vec_FltPush(&Entry_00->vAreaFrom,fVar9);
        fVar9 = Vec_StrGetF(vOut,pPos);
        Vec_FltPush(&Entry_00->vAreaTo,fVar9);
        pcVar4 = Vec_StrGetS(vOut,pPos);
        Vec_PtrPush(&Entry_00->vWireLoadModel,pcVar4);
      }
    }
    for (k = Vec_StrGetI(vOut,pPos); k != 0; k = k + -1) {
      Entry_01 = Abc_SclCellAlloc();
      iVar1 = SC_LibCellNum(p);
      Entry_01->Id = iVar1;
      Vec_PtrPush(&p->vCells,Entry_01);
      pcVar4 = Vec_StrGetS(vOut,pPos);
      Entry_01->pName = pcVar4;
      fVar9 = Vec_StrGetF(vOut,pPos);
      Entry_01->area = fVar9;
      fVar9 = Vec_StrGetF(vOut,pPos);
      Entry_01->leakage = fVar9;
      iVar1 = Vec_StrGetI(vOut,pPos);
      Entry_01->drive_strength = iVar1;
      iVar1 = Vec_StrGetI(vOut,pPos);
      Entry_01->n_inputs = iVar1;
      iVar1 = Vec_StrGetI(vOut,pPos);
      Entry_01->n_outputs = iVar1;
      iVar1 = Scl_Flt2Int(Entry_01->area);
      Entry_01->areaI = iVar1;
      iVar1 = Scl_Flt2Int(Entry_01->leakage);
      Entry_01->leakageI = iVar1;
      for (n = 0; n < Entry_01->n_inputs; n = n + 1) {
        pSVar5 = Abc_SclPinAlloc();
        Vec_PtrPush(&Entry_01->vPins,pSVar5);
        pSVar5->dir = sc_dir_Input;
        pcVar4 = Vec_StrGetS(vOut,pPos);
        pSVar5->pName = pcVar4;
        fVar9 = Vec_StrGetF(vOut,pPos);
        pSVar5->rise_cap = fVar9;
        fVar9 = Vec_StrGetF(vOut,pPos);
        pSVar5->fall_cap = fVar9;
        iVar1 = Scl_Flt2Int(pSVar5->rise_cap);
        pSVar5->rise_capI = iVar1;
        iVar1 = Scl_Flt2Int(pSVar5->fall_cap);
        pSVar5->fall_capI = iVar1;
      }
      for (n = 0; n < Entry_01->n_outputs; n = n + 1) {
        pSVar5 = Abc_SclPinAlloc();
        Vec_PtrPush(&Entry_01->vPins,pSVar5);
        pSVar5->dir = sc_dir_Output;
        pcVar4 = Vec_StrGetS(vOut,pPos);
        pSVar5->pName = pcVar4;
        fVar9 = Vec_StrGetF(vOut,pPos);
        pSVar5->max_out_cap = fVar9;
        fVar9 = Vec_StrGetF(vOut,pPos);
        pSVar5->max_out_slew = fVar9;
        iVar1 = Vec_StrGetI(vOut,pPos);
        if (iVar1 != Entry_01->n_inputs) {
          __assert_fail("k == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x14f,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if (pSVar5->func_text != (char *)0x0) {
          __assert_fail("pPin->func_text == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x154,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        pcVar4 = Vec_StrGetS(vOut,pPos);
        pSVar5->func_text = pcVar4;
        if (*pSVar5->func_text == '\0') {
          if (pSVar5->func_text != (char *)0x0) {
            free(pSVar5->func_text);
            pSVar5->func_text = (char *)0x0;
          }
          iVar1 = Vec_WrdSize(&pSVar5->vFunc);
          if (iVar1 != 0) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x15a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          iVar1 = Abc_Truth6WordNum(Entry_01->n_inputs);
          Vec_WrdGrow(&pSVar5->vFunc,iVar1);
          for (version = 0; iVar1 = Vec_WrdCap(&pSVar5->vFunc), version < iVar1;
              version = version + 1) {
            wVar6 = Vec_StrGetW(vOut,pPos);
            Vec_WrdPush(&pSVar5->vFunc,wVar6);
          }
        }
        else {
          p_00 = Vec_PtrAlloc(Entry_01->n_inputs);
          for (local_38 = 0; local_38 < Entry_01->n_inputs; local_38 = local_38 + 1) {
            puVar7 = (undefined8 *)Vec_PtrEntry(&Entry_01->vPins,local_38);
            Vec_PtrPush(p_00,(void *)*puVar7);
          }
          iVar1 = Vec_WrdSize(&pSVar5->vFunc);
          if (iVar1 != 0) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x16a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          Vec_WrdErase(&pSVar5->vFunc);
          pcVar4 = pSVar5->func_text;
          ppVarNames = (char **)Vec_PtrArray(p_00);
          __ptr = Mio_ParseFormulaTruth(pcVar4,ppVarNames,Entry_01->n_inputs);
          iVar1 = __ptr->nSize;
          (pSVar5->vFunc).nCap = __ptr->nCap;
          (pSVar5->vFunc).nSize = iVar1;
          (pSVar5->vFunc).pArray = __ptr->pArray;
          if (__ptr != (Vec_Wrd_t *)0x0) {
            free(__ptr);
          }
          Vec_PtrFree(p_00);
          iVar1 = Vec_WrdSize(&pSVar5->vFunc);
          iVar2 = Abc_Truth6WordNum(Entry_01->n_inputs);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x171,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          for (version = 0; iVar1 = Vec_WrdSize(&pSVar5->vFunc), version < iVar1;
              version = version + 1) {
            wVar6 = Vec_StrGetW(vOut,pPos);
            wVar8 = Vec_WrdEntry(&pSVar5->vFunc,version);
            if (wVar6 != wVar8) {
              __assert_fail("Value == Vec_WrdEntry(&pPin->vFunc, k)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                            ,0x175,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
            }
          }
        }
        for (version = 0; version < Entry_01->n_inputs; version = version + 1) {
          Entry_02 = Abc_SclTimingsAlloc();
          Vec_PtrPush(&pSVar5->vRTimings,Entry_02);
          pcVar4 = Vec_StrGetS(vOut,pPos);
          Entry_02->pName = pcVar4;
          iVar1 = Vec_StrGetI(vOut,pPos);
          if (1 < iVar1) {
            __assert_fail("n <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x180,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          if (iVar1 == 1) {
            Entry_03 = Abc_SclTimingAlloc();
            Vec_PtrPush(&Entry_02->vTimings,Entry_03);
            SVar3 = Vec_StrGetI(vOut,pPos);
            Entry_03->tsense = SVar3;
            Abc_SclReadSurface(vOut,pPos,&Entry_03->pCellRise);
            Abc_SclReadSurface(vOut,pPos,&Entry_03->pCellFall);
            Abc_SclReadSurface(vOut,pPos,&Entry_03->pRiseTrans);
            Abc_SclReadSurface(vOut,pPos,&Entry_03->pFallTrans);
          }
          else {
            iVar1 = Vec_PtrSize(&Entry_02->vTimings);
            if (iVar1 != 0) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                            ,0x18d,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
            }
          }
        }
      }
    }
    vOut_local._4_4_ = 1;
  }
  else {
    Abc_Print(-1,"Wrong version of the SCL file.\n");
    vOut_local._4_4_ = 0;
  }
  return vOut_local._4_4_;
}

Assistant:

static int Abc_SclReadLibrary( Vec_Str_t * vOut, int * pPos, SC_Lib * p )
{
    int i, j, k, n;
    int version = Vec_StrGetI( vOut, pPos );
    if ( version != ABC_SCL_CUR_VERSION )
    { 
        Abc_Print( -1, "Wrong version of the SCL file.\n" ); 
        return 0; 
    }
    assert( version == ABC_SCL_CUR_VERSION ); // wrong version of the file

    // Read non-composite fields:
    p->pName                 = Vec_StrGetS(vOut, pPos);
    p->default_wire_load     = Vec_StrGetS(vOut, pPos);
    p->default_wire_load_sel = Vec_StrGetS(vOut, pPos);
    p->default_max_out_slew  = Vec_StrGetF(vOut, pPos);

    p->unit_time             = Vec_StrGetI(vOut, pPos);
    p->unit_cap_fst          = Vec_StrGetF(vOut, pPos);
    p->unit_cap_snd          = Vec_StrGetI(vOut, pPos);

    // Read 'wire_load' vector:
    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        SC_WireLoad * pWL = Abc_SclWireLoadAlloc();
        Vec_PtrPush( &p->vWireLoads, pWL );

        pWL->pName = Vec_StrGetS(vOut, pPos);
        pWL->cap   = Vec_StrGetF(vOut, pPos);
        pWL->slope = Vec_StrGetF(vOut, pPos);

        for ( j = Vec_StrGetI(vOut, pPos); j != 0; j-- )
        {
            Vec_IntPush( &pWL->vFanout, Vec_StrGetI(vOut, pPos) );
            Vec_FltPush( &pWL->vLen,    Vec_StrGetF(vOut, pPos) );
        }
    }

    // Read 'wire_load_sel' vector:
    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        SC_WireLoadSel * pWLS = Abc_SclWireLoadSelAlloc();
        Vec_PtrPush( &p->vWireLoadSels, pWLS );

        pWLS->pName = Vec_StrGetS(vOut, pPos);
        for ( j = Vec_StrGetI(vOut, pPos); j != 0; j-- )
        {
            Vec_FltPush( &pWLS->vAreaFrom,      Vec_StrGetF(vOut, pPos) );
            Vec_FltPush( &pWLS->vAreaTo,        Vec_StrGetF(vOut, pPos) );
            Vec_PtrPush( &pWLS->vWireLoadModel, Vec_StrGetS(vOut, pPos) );
        }
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        SC_Cell * pCell = Abc_SclCellAlloc();
        pCell->Id = SC_LibCellNum(p);
        Vec_PtrPush( &p->vCells, pCell );

        pCell->pName          = Vec_StrGetS(vOut, pPos);     
        pCell->area           = Vec_StrGetF(vOut, pPos);
        pCell->leakage        = Vec_StrGetF(vOut, pPos);
        pCell->drive_strength = Vec_StrGetI(vOut, pPos);

        pCell->n_inputs       = Vec_StrGetI(vOut, pPos);
        pCell->n_outputs      = Vec_StrGetI(vOut, pPos);

        pCell->areaI          = Scl_Flt2Int(pCell->area);
        pCell->leakageI       = Scl_Flt2Int(pCell->leakage);
/*
        printf( "%s\n", pCell->pName );
        if ( !strcmp( "XOR3_X4M_A9TL", pCell->pName ) )
        {
            int s = 0;
        }
*/
        for ( j = 0; j < pCell->n_inputs; j++ )
        {
            SC_Pin * pPin = Abc_SclPinAlloc();
            Vec_PtrPush( &pCell->vPins, pPin );

            pPin->dir      = sc_dir_Input;
            pPin->pName    = Vec_StrGetS(vOut, pPos); 
            pPin->rise_cap = Vec_StrGetF(vOut, pPos);
            pPin->fall_cap = Vec_StrGetF(vOut, pPos);

            pPin->rise_capI = Scl_Flt2Int(pPin->rise_cap);
            pPin->fall_capI = Scl_Flt2Int(pPin->fall_cap);
        }

        for ( j = 0; j < pCell->n_outputs; j++ )
        {
            SC_Pin * pPin = Abc_SclPinAlloc();
            Vec_PtrPush( &pCell->vPins, pPin );

            pPin->dir          = sc_dir_Output;
            pPin->pName        = Vec_StrGetS(vOut, pPos); 
            pPin->max_out_cap  = Vec_StrGetF(vOut, pPos);
            pPin->max_out_slew = Vec_StrGetF(vOut, pPos);

            k = Vec_StrGetI(vOut, pPos);
            assert( k == pCell->n_inputs );

            // read function
            // (possibly empty) formula is always given
            assert( version == ABC_SCL_CUR_VERSION );
            assert( pPin->func_text == NULL );
            pPin->func_text = Vec_StrGetS(vOut, pPos); 
            if ( pPin->func_text[0] == 0 )
            {
                // formula is not given - read truth table
                ABC_FREE( pPin->func_text );
                assert( Vec_WrdSize(&pPin->vFunc) == 0 );
                Vec_WrdGrow( &pPin->vFunc, Abc_Truth6WordNum(pCell->n_inputs) );
                for ( k = 0; k < Vec_WrdCap(&pPin->vFunc); k++ )
                    Vec_WrdPush( &pPin->vFunc, Vec_StrGetW(vOut, pPos) );
            }
            else
            {
                // formula is given - derive truth table
                SC_Pin * pPin2;
                Vec_Ptr_t * vNames;
                Vec_Wrd_t * vFunc;
                // collect input names
                vNames = Vec_PtrAlloc( pCell->n_inputs );
                SC_CellForEachPinIn( pCell, pPin2, n )
                    Vec_PtrPush( vNames, pPin2->pName );
                // derive truth table
                assert( Vec_WrdSize(&pPin->vFunc) == 0 );
                Vec_WrdErase( &pPin->vFunc );
                vFunc = Mio_ParseFormulaTruth( pPin->func_text, (char **)Vec_PtrArray(vNames), pCell->n_inputs );
                pPin->vFunc = *vFunc;
                ABC_FREE( vFunc );
                Vec_PtrFree( vNames );
                // skip truth table
                assert( Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs) );
                for ( k = 0; k < Vec_WrdSize(&pPin->vFunc); k++ )
                {
                    word Value = Vec_StrGetW(vOut, pPos);
                    assert( Value == Vec_WrdEntry(&pPin->vFunc, k) );
                }
            }

            // Read 'rtiming': (pin-to-pin timing tables for this particular output)
            for ( k = 0; k < pCell->n_inputs; k++ )
            {
                SC_Timings * pRTime = Abc_SclTimingsAlloc();
                Vec_PtrPush( &pPin->vRTimings, pRTime );

                pRTime->pName = Vec_StrGetS(vOut, pPos);
                n = Vec_StrGetI(vOut, pPos); assert( n <= 1 );
                if ( n == 1 )
                {
                    SC_Timing * pTime = Abc_SclTimingAlloc();
                    Vec_PtrPush( &pRTime->vTimings, pTime );

                    pTime->tsense = (SC_TSense)Vec_StrGetI(vOut, pPos);
                    Abc_SclReadSurface( vOut, pPos, &pTime->pCellRise );
                    Abc_SclReadSurface( vOut, pPos, &pTime->pCellFall );
                    Abc_SclReadSurface( vOut, pPos, &pTime->pRiseTrans );
                    Abc_SclReadSurface( vOut, pPos, &pTime->pFallTrans );
                }
                else
                    assert( Vec_PtrSize(&pRTime->vTimings) == 0 );
            }
        }
    }
    return 1;
}